

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O2

void __thiscall pg::NPPSolver::~NPPSolver(NPPSolver *this)

{
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *p_Var1;
  bitset *pbVar2;
  _List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *p_Var3;
  uint i;
  uint uVar4;
  
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__NPPSolver_001a95e8;
  if (this->inverse != (int *)0x0) {
    operator_delete__(this->inverse);
  }
  p_Var1 = &(*(this->Heads).
              super__Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>;
  if (p_Var1 != (_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(p_Var1);
  }
  operator_delete(p_Var1,0x50);
  pbVar2 = *(this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pbVar2 != (bitset *)0x0) {
    bitset::~bitset(pbVar2);
  }
  operator_delete(pbVar2,0x20);
  p_Var3 = &(*(this->Entries).
              super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ;
  if (p_Var3 != (_List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)0x0) {
    std::__cxx11::
    _List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::_M_clear(p_Var3);
  }
  operator_delete(p_Var3,0x18);
  for (uVar4 = 1; uVar4 <= this->End; uVar4 = uVar4 + 1) {
    pbVar2 = (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl
             .super__Vector_impl_data._M_start[uVar4];
    if (pbVar2 != (bitset *)0x0) {
      bitset::~bitset(pbVar2);
    }
    operator_delete(pbVar2,0x20);
    p_Var1 = &(this->Heads).
              super__Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar4]->
              super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>;
    if (p_Var1 != (_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(p_Var1);
    }
    operator_delete(p_Var1,0x50);
    pbVar2 = (this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4];
    if (pbVar2 != (bitset *)0x0) {
      bitset::~bitset(pbVar2);
    }
    operator_delete(pbVar2,0x20);
    p_Var3 = &(this->Entries).
              super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar4]->
              super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ;
    if (p_Var3 != (_List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)0x0) {
      std::__cxx11::
      _List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::_M_clear(p_Var3);
    }
    operator_delete(p_Var3,0x18);
  }
  uintqueue::~uintqueue(&this->E);
  uintqueue::~uintqueue(&this->T);
  bitset::~bitset(&this->O);
  bitset::~bitset(&this->D);
  bitset::~bitset(&this->R);
  std::
  _Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
  ::~_Vector_base(&(this->Entries).
                   super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                 );
  std::_Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>::~_Vector_base
            (&(this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>);
  std::
  _Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~_Vector_base(&(this->Heads).
                   super__Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 );
  std::_Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>::~_Vector_base
            (&(this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->Phase).super__Bvector_base<std::allocator<bool>_>);
  bitset::~bitset(&this->winzero);
  bitset::~bitset(&this->outgame);
  return;
}

Assistant:

NPPSolver::~NPPSolver()
{
    delete[] inverse;
    delete Heads[0];
    delete Exits[0];
    delete Entries[0];
    for (uint i = 1; i <= End; ++i)
    {
        delete Supgame[i];
        delete Heads[i];
        delete Exits[i];
        delete Entries[i];
    }
}